

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

void __thiscall lattice::print(lattice *this)

{
  char cVar1;
  int iVar2;
  int j;
  int iVar3;
  int i;
  int iVar4;
  
  for (iVar4 = 0; iVar2 = this->L, iVar4 < iVar2; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      cVar1 = '#';
      if ((this->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar2 * iVar3 + iVar4] < 0) {
        cVar1 = '.';
      }
      std::operator<<((ostream *)&std::cout,cVar1);
      iVar2 = this->L;
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void lattice::print() const {
  for (int i{0}; i < L; ++i) {
    for (int j{0}; j < L; ++j)
      if (s[i + j * L] < 0)
        std::cout << '.';
      else
        std::cout << '#';
    std::cout << '\n';
  }
  std::cout << std::endl;
}